

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal.c
# Opt level: O1

void stealamulet(monst *mtmp)

{
  boolean bVar1;
  short sVar2;
  short sVar3;
  char *pcVar4;
  char *pcVar5;
  obj **otmp;
  obj *poVar6;
  
  if ((u.uhave._0_1_ & 1) == 0) {
    if (((u.uhave._0_1_ & 0x10) != 0) &&
       (sVar3 = mtmp->mnum, sVar2 = quest_info(0x20), sVar3 == sVar2)) {
      otmp = &invent;
      do {
        otmp = &((obj *)otmp)->nobj->nobj;
        if ((obj *)otmp == (obj *)0x0) {
          return;
        }
        bVar1 = is_quest_artifact((obj *)otmp);
      } while (bVar1 == '\0');
      sVar2 = 0;
LAB_00255a70:
      sVar3 = 0;
      goto LAB_00255a88;
    }
    sVar3 = 0;
    if ((u.uhave._0_1_ & 2) == 0) {
      if ((u.uhave._0_1_ & 4) == 0) {
        if ((u.uhave._0_1_ & 8) == 0) {
          return;
        }
        otmp = (obj **)0x0;
        sVar2 = 0x10b;
        goto LAB_00255a70;
      }
      sVar2 = 0x1bd;
    }
    else {
      sVar3 = 0x104;
      sVar2 = 0x10c;
    }
  }
  else {
    sVar3 = 0xd8;
    sVar2 = 0xd9;
  }
  otmp = (obj **)0x0;
LAB_00255a88:
  poVar6 = invent;
  if ((obj *)otmp == (obj *)0x0) {
    for (; poVar6 != (obj *)0x0; poVar6 = poVar6->nobj) {
      otmp = &poVar6->nobj;
      if ((sVar2 == poVar6->otyp) || ((sVar3 == poVar6->otyp && ((mtmp->field_0x63 & 0x20) == 0))))
      goto LAB_00255ab7;
    }
    otmp = (obj **)0x0;
  }
LAB_00255ab7:
  if ((obj *)otmp != (obj *)0x0) {
    if (((obj *)otmp)->owornmask != 0) {
      remove_worn_item((obj *)otmp,'\x01');
    }
    freeinv((obj *)otmp);
    mpickobj(mtmp,(obj *)otmp);
    pcVar4 = Monnam(mtmp);
    pcVar5 = doname((obj *)otmp);
    pline("%s stole %s!",pcVar4,pcVar5);
    if (((mtmp->data->mflags1 & 0x2000000) != 0) && (bVar1 = tele_restrict(mtmp), bVar1 == '\0')) {
      rloc(level,mtmp,'\0');
      return;
    }
  }
  return;
}

Assistant:

void stealamulet(struct monst *mtmp)
{
    struct obj *otmp = NULL;
    int real=0, fake=0;

    /* select the artifact to steal */
    if (u.uhave.amulet) {
	real = AMULET_OF_YENDOR;
	fake = FAKE_AMULET_OF_YENDOR;
    } else if (u.uhave.questart && mtmp->mnum == quest_info(MS_NEMESIS)) {
	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (is_quest_artifact(otmp)) break;
	if (!otmp) return;	/* should we panic instead? */
    } else if (u.uhave.bell) {
	real = BELL_OF_OPENING;
	fake = BELL;
    } else if (u.uhave.book) {
	real = SPE_BOOK_OF_THE_DEAD;
    } else if (u.uhave.menorah) {
	real = CANDELABRUM_OF_INVOCATION;
    } else return;	/* you have nothing of special interest */

    if (!otmp) {
	/* If we get here, real and fake have been set up. */
	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (otmp->otyp == real || (otmp->otyp == fake && !mtmp->iswiz))
		break;
    }

    if (otmp) { /* we have something to snatch */
	if (otmp->owornmask)
	    remove_worn_item(otmp, TRUE);
	freeinv(otmp);
	/* mpickobj wont merge otmp because none of the above things
	   to steal are mergable */
	mpickobj(mtmp,otmp);	/* may merge and free otmp */
	pline("%s stole %s!", Monnam(mtmp), doname(otmp));
	if (can_teleport(mtmp->data) && !tele_restrict(mtmp))
	    rloc(level, mtmp, FALSE);
    }
}